

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void cftf082(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double y7i;
  double y7r;
  double y6i;
  double y6r;
  double y5i;
  double y5r;
  double y4i;
  double y4r;
  double y3i;
  double y3r;
  double y2i;
  double y2r;
  double y1i;
  double y1r;
  double y0i;
  double y0r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk1i;
  double wk1r;
  double wn4r;
  double *w_local;
  double *a_local;
  
  dVar8 = w[1];
  dVar16 = w[2];
  dVar17 = w[3];
  dVar21 = *a;
  dVar22 = a[1];
  dVar1 = *a;
  dVar2 = a[9];
  dVar3 = a[1];
  dVar4 = a[8];
  dVar5 = dVar8 * ((a[4] - a[0xd]) - (a[5] + a[0xc]));
  dVar6 = dVar8 * (a[5] + a[0xc] + (a[4] - a[0xd]));
  dVar7 = dVar8 * ((a[4] + a[0xd]) - (a[5] - a[0xc]));
  dVar8 = dVar8 * ((a[5] - a[0xc]) + a[4] + a[0xd]);
  dVar9 = dVar16 * (a[2] - a[0xb]) + -(dVar17 * (a[3] + a[10]));
  dVar10 = dVar16 * (a[3] + a[10]) + dVar17 * (a[2] - a[0xb]);
  dVar11 = dVar17 * (a[2] + a[0xb]) + -(dVar16 * (a[3] - a[10]));
  dVar12 = dVar17 * (a[3] - a[10]) + dVar16 * (a[2] + a[0xb]);
  dVar13 = dVar17 * (a[6] - a[0xf]) + -(dVar16 * (a[7] + a[0xe]));
  dVar14 = dVar17 * (a[7] + a[0xe]) + dVar16 * (a[6] - a[0xf]);
  dVar15 = dVar16 * (a[6] + a[0xf]) + -(dVar17 * (a[7] - a[0xe]));
  dVar16 = dVar16 * (a[7] - a[0xe]) + dVar17 * (a[6] + a[0xf]);
  dVar17 = (dVar21 - a[9]) + dVar5;
  dVar18 = dVar22 + a[8] + dVar6;
  dVar19 = dVar9 + dVar13;
  dVar20 = dVar10 + dVar14;
  *a = dVar17 + dVar19;
  a[1] = dVar18 + dVar20;
  a[2] = dVar17 - dVar19;
  a[3] = dVar18 - dVar20;
  dVar5 = (dVar21 - a[9]) - dVar5;
  dVar6 = (dVar22 + a[8]) - dVar6;
  dVar9 = dVar9 - dVar13;
  dVar10 = dVar10 - dVar14;
  a[4] = dVar5 - dVar10;
  a[5] = dVar6 + dVar9;
  a[6] = dVar5 + dVar10;
  a[7] = dVar6 - dVar9;
  dVar17 = (dVar1 + dVar2) - dVar8;
  dVar21 = (dVar3 - dVar4) + dVar7;
  dVar22 = dVar11 - dVar15;
  dVar13 = dVar12 - dVar16;
  a[8] = dVar17 + dVar22;
  a[9] = dVar21 + dVar13;
  a[10] = dVar17 - dVar22;
  a[0xb] = dVar21 - dVar13;
  dVar8 = dVar1 + dVar2 + dVar8;
  dVar7 = (dVar3 - dVar4) - dVar7;
  dVar11 = dVar11 + dVar15;
  dVar12 = dVar12 + dVar16;
  a[0xc] = dVar8 - dVar12;
  a[0xd] = dVar7 + dVar11;
  a[0xe] = dVar8 + dVar12;
  a[0xf] = dVar7 - dVar11;
  return;
}

Assistant:

void cftf082(double *a, double *w) {
  double wn4r, wk1r, wk1i, x0r, x0i, x1r, x1i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
    y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i;

  wn4r = w[1];
  wk1r = w[2];
  wk1i = w[3];
  y0r = a[0] - a[9];
  y0i = a[1] + a[8];
  y1r = a[0] + a[9];
  y1i = a[1] - a[8];
  x0r = a[4] - a[13];
  x0i = a[5] + a[12];
  y2r = wn4r * (x0r - x0i);
  y2i = wn4r * (x0i + x0r);
  x0r = a[4] + a[13];
  x0i = a[5] - a[12];
  y3r = wn4r * (x0r - x0i);
  y3i = wn4r * (x0i + x0r);
  x0r = a[2] - a[11];
  x0i = a[3] + a[10];
  y4r = wk1r * x0r - wk1i * x0i;
  y4i = wk1r * x0i + wk1i * x0r;
  x0r = a[2] + a[11];
  x0i = a[3] - a[10];
  y5r = wk1i * x0r - wk1r * x0i;
  y5i = wk1i * x0i + wk1r * x0r;
  x0r = a[6] - a[15];
  x0i = a[7] + a[14];
  y6r = wk1i * x0r - wk1r * x0i;
  y6i = wk1i * x0i + wk1r * x0r;
  x0r = a[6] + a[15];
  x0i = a[7] - a[14];
  y7r = wk1r * x0r - wk1i * x0i;
  y7i = wk1r * x0i + wk1i * x0r;
  x0r = y0r + y2r;
  x0i = y0i + y2i;
  x1r = y4r + y6r;
  x1i = y4i + y6i;
  a[0] = x0r + x1r;
  a[1] = x0i + x1i;
  a[2] = x0r - x1r;
  a[3] = x0i - x1i;
  x0r = y0r - y2r;
  x0i = y0i - y2i;
  x1r = y4r - y6r;
  x1i = y4i - y6i;
  a[4] = x0r - x1i;
  a[5] = x0i + x1r;
  a[6] = x0r + x1i;
  a[7] = x0i - x1r;
  x0r = y1r - y3i;
  x0i = y1i + y3r;
  x1r = y5r - y7r;
  x1i = y5i - y7i;
  a[8] = x0r + x1r;
  a[9] = x0i + x1i;
  a[10] = x0r - x1r;
  a[11] = x0i - x1i;
  x0r = y1r + y3i;
  x0i = y1i - y3r;
  x1r = y5r + y7r;
  x1i = y5i + y7i;
  a[12] = x0r - x1i;
  a[13] = x0i + x1r;
  a[14] = x0r + x1i;
  a[15] = x0i - x1r;
}